

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
jessilib::
split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,jessilib *this,char *begin,char *end,char *in_delim_begin,
          char *in_delim_end)

{
  bool bVar1;
  char *pcVar2;
  char in_delim;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  size_t local_a0;
  char *local_98;
  size_t local_90;
  char *local_88;
  size_t local_80;
  char *local_78;
  jessilib *local_70;
  char *itr;
  char *itr_end;
  char *local_58;
  undefined1 local_50 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  result;
  difference_type delim_length;
  char *in_delim_end_local;
  char *in_delim_begin_local;
  char *end_local;
  char *begin_local;
  
  in_delim = (char)in_delim_begin;
  result.second._M_str = (char *)std::distance<char_const*>(end,in_delim_begin);
  if (result.second._M_str == (char *)0x1) {
    split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char>
              (__return_storage_ptr__,this,begin,(char *)(ulong)(uint)(int)*end,in_delim);
  }
  else {
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)local_50);
    if (this < begin) {
      if ((end < in_delim_begin) && ((long)result.second._M_str <= (long)begin - (long)this)) {
        pcVar2 = result.second._M_str + -1;
        for (local_70 = this; local_70 < (jessilib *)(begin + -(long)pcVar2);
            local_70 = local_70 + 1) {
          bVar1 = std::equal<char_const*,char_const*>(end,in_delim_begin,(char *)local_70);
          if (bVar1) {
            bVar3 = make_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                              ((char *)this,(char *)local_70);
            local_80 = bVar3._M_len;
            local_50 = (undefined1  [8])local_80;
            local_78 = bVar3._M_str;
            result.first._M_len = (size_t)local_78;
            bVar3 = make_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                              ((char *)(local_70 + (long)result.second._M_str),begin);
            local_90 = bVar3._M_len;
            local_88 = bVar3._M_str;
            (__return_storage_ptr__->first)._M_len = (size_t)local_50;
            (__return_storage_ptr__->first)._M_str = (char *)result.first._M_len;
            (__return_storage_ptr__->second)._M_len = local_90;
            (__return_storage_ptr__->second)._M_str = local_88;
            return __return_storage_ptr__;
          }
        }
        bVar3 = make_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                          ((char *)this,begin);
        local_a0 = bVar3._M_len;
        local_98 = bVar3._M_str;
        (__return_storage_ptr__->first)._M_len = local_a0;
        (__return_storage_ptr__->first)._M_str = local_98;
        (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
        (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
      }
      else {
        bVar3 = make_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                          ((char *)this,begin);
        itr_end = (char *)bVar3._M_len;
        local_58 = bVar3._M_str;
        (__return_storage_ptr__->first)._M_len = (size_t)itr_end;
        (__return_storage_ptr__->first)._M_str = local_58;
        (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
        (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
      }
    }
    else {
      (__return_storage_ptr__->first)._M_len = (size_t)local_50;
      (__return_storage_ptr__->first)._M_str = (char *)result.first._M_len;
      (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
      (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, DelimItrT in_delim_begin, DelimEndT in_delim_end) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using ElementT = std::remove_cvref_t<decltype(*begin)>;
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	auto delim_length = std::distance(in_delim_begin, in_delim_end);
	if (delim_length == 1) {
		return split_once<OptionalMemberT...>(begin, end, *in_delim_begin);
	}

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	if (in_delim_begin >= in_delim_end
		|| (end - begin) < delim_length) {
		// Absent or impossible to match delimiter, therefore no match, therefore return input as single token
		result.first = make_split_member<MemberT>(begin, end);
		return result;
	}

	auto itr_end = end - (delim_length - 1);
	for (auto itr = begin; itr < itr_end; ++itr) {
		if (std::equal(in_delim_begin, in_delim_end, itr)) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + delim_length, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}